

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::GPUShaderFP64Test4::iterate(GPUShaderFP64Test4 *this)

{
  bool *pbVar1;
  byte bVar2;
  bool bVar3;
  char *description;
  TestContext *this_00;
  
  initProgramObjects(this);
  generateUniformValues(this);
  initUniformValues(this);
  bVar3 = verifyUniformValues(this);
  this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar3);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_program_interface_query");
  if (bVar3) {
    bVar3 = verifyProgramInterfaceQuerySupport(this);
    pbVar1 = &this->m_has_test_passed;
    *pbVar1 = (bool)(*pbVar1 & bVar3);
    bVar2 = *pbVar1;
  }
  else {
    bVar2 = this->m_has_test_passed & 1;
  }
  if (bVar2 != 0) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  tcu::TestContext::setTestResult(this_00,(uint)(bVar2 == 0),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test4::iterate()
{
	/* This test does not verify GL_ARB_gpu_shader_fp64 support on purpose */

	/* Initialize all objects required to run the test */
	initTest();

	/* Verify the implementation reports correct values for all stages we've configured */
	m_has_test_passed &= verifyUniformValues();

	/* Is this also the case when "program interface query" mechanism is used? */
	if (m_context.getContextInfo().isExtensionSupported("GL_ARB_program_interface_query"))
	{
		m_has_test_passed &= verifyProgramInterfaceQuerySupport();
	}

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}